

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O2

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeSwitch
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *labels,Index defaultLabel)

{
  pointer *this_00;
  Index label;
  Index *pIVar1;
  undefined8 this_01;
  _Storage<wasm::Type,_true> a;
  _Copy_ctor_base<false,_wasm::Name,_wasm::Err> *p_Var2;
  Switch *expr;
  pointer *__x;
  _Variant_storage<false,_wasm::Name,_wasm::Err> *this_02;
  Index *pIVar3;
  optional<wasm::Type> labelType;
  Name default_;
  undefined1 local_150 [8];
  Result<wasm::Type> defaultType;
  vector<wasm::Name,_std::allocator<wasm::Name>_> names;
  Switch curr;
  ChildPopper local_b8 [4];
  undefined1 local_98 [8];
  Result<wasm::Name> defaultName;
  undefined1 local_68 [8];
  Result<wasm::Type> _val_2;
  
  getLabelType((Result<wasm::Type> *)local_150,this,defaultLabel);
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::Type,_wasm::Err>::_Copy_ctor_base
            ((_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)
             &names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)local_150);
  if ((char)curr.targets.super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements ==
      '\x01') {
    std::__cxx11::string::string
              ((string *)local_98,
               (string *)
               &names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_98);
    std::__cxx11::string::~string((string *)local_98);
    std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)
               &names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  else {
    this_00 = &names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    defaultName.val.super__Variant_base<wasm::Name,_wasm::Err>.
    super__Move_assign_alias<wasm::Name,_wasm::Err>.super__Copy_assign_alias<wasm::Name,_wasm::Err>.
    super__Move_ctor_alias<wasm::Name,_wasm::Err>.super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
    super__Variant_storage_alias<wasm::Name,_wasm::Err>._36_4_ = defaultLabel;
    _val_2.val.super__Variant_base<wasm::Type,_wasm::Err>.
    super__Move_assign_alias<wasm::Type,_wasm::Err>.super__Copy_assign_alias<wasm::Type,_wasm::Err>.
    super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
    super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_ = this;
    std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)this_00);
    defaultType.val.super__Variant_base<wasm::Type,_wasm::Err>.
    super__Move_assign_alias<wasm::Type,_wasm::Err>.super__Copy_assign_alias<wasm::Type,_wasm::Err>.
    super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
    super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_index = '\0';
    defaultType.val.super__Variant_base<wasm::Type,_wasm::Err>.
    super__Move_assign_alias<wasm::Type,_wasm::Err>.super__Copy_assign_alias<wasm::Type,_wasm::Err>.
    super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
    super__Variant_storage_alias<wasm::Type,_wasm::Err>._33_7_ = 0;
    names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::reserve
              ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)
               ((long)&defaultType.val.super__Variant_base<wasm::Type,_wasm::Err>.
                       super__Move_assign_alias<wasm::Type,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),
               (long)(labels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(labels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start >> 2);
    pIVar1 = (labels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    a = (_Storage<wasm::Type,_true>)local_150;
    for (pIVar3 = (labels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        this_01 = _val_2.val.super__Variant_base<wasm::Type,_wasm::Err>.
                  super__Move_assign_alias<wasm::Type,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_, pIVar3 != pIVar1;
        pIVar3 = pIVar3 + 1) {
      label = *pIVar3;
      getLabelName((Result<wasm::Name> *)this_00,
                   (IRBuilder *)
                   _val_2.val.super__Variant_base<wasm::Type,_wasm::Err>.
                   super__Move_assign_alias<wasm::Type,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_,label,false);
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::Name,_wasm::Err>::_Copy_ctor_base
                ((_Copy_ctor_base<false,_wasm::Name,_wasm::Err> *)local_98,
                 (_Copy_ctor_base<false,_wasm::Name,_wasm::Err> *)this_00);
      if (defaultName.val.super__Variant_base<wasm::Name,_wasm::Err>.
          super__Move_assign_alias<wasm::Name,_wasm::Err>.
          super__Copy_assign_alias<wasm::Name,_wasm::Err>.
          super__Move_ctor_alias<wasm::Name,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
          super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._24_1_ == '\x01') {
        std::__cxx11::string::string((string *)local_68,(string *)local_98);
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
        _Variant_storage<1ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_68);
        std::__cxx11::string::~string((string *)local_68);
        std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Name,_wasm::Err> *)local_98);
LAB_00cdbc94:
        this_02 = (_Variant_storage<false,_wasm::Name,_wasm::Err> *)
                  &names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        goto LAB_00cdbd93;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Name,_wasm::Err> *)local_98);
      __x = (pointer *)0x0;
      if ((char)curr.targets.super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements
          == '\0') {
        __x = this_00;
      }
      std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
                ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)
                 ((long)&defaultType.val.super__Variant_base<wasm::Type,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),(value_type *)__x);
      getLabelType((Result<wasm::Type> *)local_98,
                   (IRBuilder *)
                   _val_2.val.super__Variant_base<wasm::Type,_wasm::Err>.
                   super__Move_assign_alias<wasm::Type,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_,label);
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::Type,_wasm::Err>::_Copy_ctor_base
                ((_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)local_68,
                 (_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)local_98);
      if (_val_2.val.super__Variant_base<wasm::Type,_wasm::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._24_1_ == '\x01') {
        std::__cxx11::string::string((string *)local_b8,(string *)local_68);
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
        _Variant_storage<1ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_b8);
        std::__cxx11::string::~string((string *)local_b8);
        std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)local_68);
        std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)local_98);
        goto LAB_00cdbc94;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)local_68);
      a._M_value = wasm::Type::getGreatestLowerBound(a._M_value,(Type)local_98);
      std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)local_98);
      std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Name,_wasm::Err> *)this_00);
    }
    getLabelName((Result<wasm::Name> *)local_98,
                 (IRBuilder *)
                 _val_2.val.super__Variant_base<wasm::Type,_wasm::Err>.
                 super__Move_assign_alias<wasm::Type,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_,
                 defaultName.val.super__Variant_base<wasm::Name,_wasm::Err>.
                 super__Move_assign_alias<wasm::Name,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Name,_wasm::Err>._36_4_,false);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Name,_wasm::Err>::_Copy_ctor_base
              ((_Copy_ctor_base<false,_wasm::Name,_wasm::Err> *)
               &names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (_Copy_ctor_base<false,_wasm::Name,_wasm::Err> *)local_98);
    if ((char)curr.targets.super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements
        == '\x01') {
      std::__cxx11::string::string
                ((string *)local_68,
                 (string *)
                 &names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_68);
      std::__cxx11::string::~string((string *)local_68);
      std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Name,_wasm::Err> *)
                 &names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Name,_wasm::Err> *)
                 &names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_1_ = 5;
      local_b8[0].builder = (IRBuilder *)this_01;
      labelType.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 1;
      labelType.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload._M_value.id = (Type)(Type)a;
      ChildPopper::visitSwitch
                ((Result<wasm::Ok> *)local_68,local_b8,
                 (Switch *)
                 &names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,labelType);
      if (_val_2.val.super__Variant_base<wasm::Type,_wasm::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._24_1_ == '\x01') {
        std::__cxx11::string::string((string *)local_b8,(string *)local_68);
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
        _Variant_storage<1ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_b8);
        std::__cxx11::string::~string((string *)local_b8);
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_68);
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_68);
        p_Var2 = (_Copy_ctor_base<false,_wasm::Name,_wasm::Err> *)0x0;
        if (defaultName.val.super__Variant_base<wasm::Name,_wasm::Err>.
            super__Move_assign_alias<wasm::Name,_wasm::Err>.
            super__Copy_assign_alias<wasm::Name,_wasm::Err>.
            super__Move_ctor_alias<wasm::Name,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
            super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._24_1_ == '\0') {
          p_Var2 = (_Copy_ctor_base<false,_wasm::Name,_wasm::Err> *)local_98;
        }
        default_.super_IString.str._M_str =
             (p_Var2->super__Variant_storage_alias<wasm::Name,_wasm::Err>)._M_u._M_first._M_storage.
             super_IString.str._M_str;
        default_.super_IString.str._M_len = (size_t)local_98;
        expr = Builder::makeSwitch<std::vector<wasm::Name,std::allocator<wasm::Name>>>
                         ((Builder *)(this_01 + 0x10),
                          (vector<wasm::Name,_std::allocator<wasm::Name>_> *)
                          ((long)&defaultType.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),default_,
                          (Expression *)0x0,(Expression *)0x0);
        push((IRBuilder *)this_01,(Expression *)expr);
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
      }
    }
    this_02 = (_Variant_storage<false,_wasm::Name,_wasm::Err> *)local_98;
LAB_00cdbd93:
    std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::Err>::~_Variant_storage
              (this_02);
    std::_Vector_base<wasm::Name,_std::allocator<wasm::Name>_>::~_Vector_base
              ((_Vector_base<wasm::Name,_std::allocator<wasm::Name>_> *)
               ((long)&defaultType.val.super__Variant_base<wasm::Type,_wasm::Err>.
                       super__Move_assign_alias<wasm::Type,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
  }
  std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)local_150);
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeSwitch(const std::vector<Index>& labels,
                               Index defaultLabel) {
  auto defaultType = getLabelType(defaultLabel);
  CHECK_ERR(defaultType);

  std::vector<Name> names;
  names.reserve(labels.size());
  Type glbLabelType = *defaultType;
  for (auto label : labels) {
    auto name = getLabelName(label);
    CHECK_ERR(name);
    names.push_back(*name);
    auto type = getLabelType(label);
    CHECK_ERR(type);
    glbLabelType = Type::getGreatestLowerBound(glbLabelType, *type);
  }

  auto defaultName = getLabelName(defaultLabel);
  CHECK_ERR(defaultName);

  Switch curr(wasm.allocator);
  CHECK_ERR(ChildPopper{*this}.visitSwitch(&curr, glbLabelType));
  push(builder.makeSwitch(names, *defaultName, curr.condition, curr.value));
  return Ok{};
}